

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compaction.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long *plVar4;
  ostream *poVar5;
  size_t __i;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int i;
  uint64_t key;
  string path;
  string value;
  KVStore store;
  random_device rd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3bb0;
  string local_3b90;
  undefined8 local_3b70;
  long *local_3b68 [2];
  long local_3b58 [2];
  undefined1 local_3b48 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b30 [631];
  random_device local_13b8;
  
  local_3bb0._M_dataplus._M_p = (pointer)&local_3bb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3bb0,"../data","");
  uVar2 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,">>>>> Compaction Test <<<<<",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::random_device::random_device(&local_13b8);
  std::random_device::_M_getval();
  lVar6 = 1;
  do {
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  local_3b68[0] = local_3b58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b68,local_3bb0._M_dataplus._M_p,
             local_3bb0._M_dataplus._M_p + local_3bb0._M_string_length);
  iVar1 = stat((char *)local_3b68[0],(stat *)local_3b48);
  if (local_3b68[0] != local_3b58) {
    operator_delete(local_3b68[0],local_3b58[0] + 1);
  }
  if (((byte)((uint)local_3b30[0]._0_4_ >> 0xe) & 1 & iVar1 == 0) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b48,
                   "rm -rf ",&local_3bb0);
    system((char *)local_3b48._0_8_);
    if ((undefined1 *)local_3b48._0_8_ != local_3b48 + 0x10) {
      operator_delete((void *)local_3b48._0_8_,local_3b48._16_8_ + 1);
    }
  }
  KVStore::KVStore((KVStore *)local_3b48,&local_3bb0);
  local_3b90._M_dataplus._M_p = (pointer)&local_3b90.field_2;
  local_3b70 = uVar2;
  std::__cxx11::string::_M_construct((ulong)&local_3b90,-0x80);
  key = 0;
  iVar1 = 0;
  iVar7 = 0;
  uVar8 = 0;
  do {
    lVar6 = std::chrono::_V2::system_clock::now();
    KVStore::put((KVStore *)local_3b48,key,&local_3b90);
    lVar3 = std::chrono::_V2::system_clock::now();
    uVar8 = uVar8 + (lVar3 - lVar6) / 1000;
    if ((ulong)(long)iVar7 < uVar8 / 1000000) {
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)key - iVar1);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      iVar7 = iVar7 + 1;
      iVar1 = (int)key;
    }
    key = key + 1;
  } while (key != 50000);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," puts per compaction, Delay: ",0x1d);
  poVar5 = std::ostream::_M_insert<double>((double)(uVar8 / 1000000) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"ms",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::chrono::_V2::system_clock::now();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,">>>>> Summary <<<<<",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"It takes ",9);
  poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s to complete the test.",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b90._M_dataplus._M_p != &local_3b90.field_2) {
    operator_delete(local_3b90._M_dataplus._M_p,local_3b90.field_2._M_allocated_capacity + 1);
  }
  KVStore::~KVStore((KVStore *)local_3b48);
  std::random_device::_M_fini();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3bb0._M_dataplus._M_p != &local_3bb0.field_2) {
    operator_delete(local_3bb0._M_dataplus._M_p,local_3bb0.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main() {
  string path = "../data";

  auto start = high_resolution_clock::now();
  cout << ">>>>> Compaction Test <<<<<" << endl;

  random_device rd;
  mt19937 mt(rd());

  int remain = 2 * 1024 * 1024 - 32 - 10240 - 1000 * 12;

  auto f = 10;

  if (utils::dirExists(path)) {
    string cmd = "rm -rf " + path;
    system(cmd.c_str());
  }
  KVStore store(path);
  string value(remain / f, 's');

  unsigned long long mis = 0;
  int sec = 0;
  int ii = 0;
  for (int i = 0; i < f * 5000; i++) {
    auto s = high_resolution_clock::now();
    store.put(i, value);
    auto e = high_resolution_clock::now();
    mis += duration_cast<microseconds>(e - s).count();
    if (mis / 1000 / 1000 > sec) {
      cout << i - ii << endl;
      ii = i;
      sec++;
    }
  }
  cout << f << " puts per compaction, Delay: "
       << mis / 1000 / 1000 / (double)(f * 100) << "ms" << endl;

  // cout << "no compaction, ";
  // µs = 0;
  // KVStore store2(path);
  // for (int i = 0; i < 200000; i++) {
  //   auto key = mt();
  //   auto s = high_resolution_clock::now();
  //   store2.put(key, "s");
  //   auto e = high_resolution_clock::now();
  //   µs += duration_cast<nanoseconds>(e - s).count();
  // }
  // cout << "Delay: " << µs / 1000 / 1000 / (double)(200000) << "ms" << endl;

  auto end = high_resolution_clock::now();
  auto totalTime = duration_cast<seconds>(end - start).count();

  cout << endl;
  cout << ">>>>> Summary <<<<<" << endl;
  cout << "It takes " << totalTime << "s to complete the test." << endl;
}